

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O2

string * __thiscall
ExtendedMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,ExtendedMatrix *this)

{
  Matrix *this_00;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  Fraction *pFVar4;
  int i;
  ostringstream out;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"\\begin{bmatrix}");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = &this->extension_;
  i = 0;
  while( true ) {
    iVar1 = Matrix::GetNumRows(&this->main_);
    if (iVar1 <= i) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = Matrix::GetNumColumns(&this->main_);
      if (iVar2 <= iVar1) break;
      pFVar4 = Matrix::At(&this->main_,i,iVar1);
      Fraction::ToLaTex_abi_cxx11_(&local_1c8,pFVar4);
      poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      std::operator<<(poVar3," & ");
      std::__cxx11::string::~string((string *)&local_1c8);
      iVar1 = iVar1 + 1;
    }
    std::operator<<((ostream *)local_1a8,"\\vline & ");
    iVar1 = 0;
    while( true ) {
      iVar2 = Matrix::GetNumColumns(this_00);
      if (iVar2 <= iVar1) break;
      pFVar4 = Matrix::At(this_00,i,iVar1);
      Fraction::ToLaTex_abi_cxx11_(&local_1c8,pFVar4);
      std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      iVar2 = Matrix::GetNumColumns(this_00);
      iVar1 = iVar1 + 1;
      if (iVar1 != iVar2) {
        std::operator<<((ostream *)local_1a8," & ");
      }
    }
    iVar1 = Matrix::GetNumRows(&this->main_);
    i = i + 1;
    if (i != iVar1) {
      std::operator<<((ostream *)local_1a8,"\\\\");
    }
    std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
  }
  std::operator<<((ostream *)local_1a8,"\\end{bmatrix}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtendedMatrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int row = 0; row < GetNumRows(); ++row) {
    for (int column = 0; column < main_.GetNumColumns(); ++column) {
      out << main_.At(row, column).ToLaTex() << " & ";
    }
    out << "\\vline & ";
    for (int column = 0; column < extension_.GetNumColumns(); ++column) {
      out << extension_.At(row, column).ToLaTex();
      if (column + 1 != extension_.GetNumColumns()) {
        out << " & ";
      }
    }
    if (row + 1 != GetNumRows()) {
      out << "\\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}